

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O1

ma_bool32 ma_dr_wav_seek_to_pcm_frame(ma_dr_wav *pWav,ma_uint64 targetFrameIndex)

{
  ushort uVar1;
  ma_bool32 mVar2;
  ma_uint64 mVar3;
  ulong uVar4;
  ma_uint64 mVar5;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  ma_int16 devnull [2048];
  ma_int16 amStack_1038 [2052];
  
  if (pWav == (ma_dr_wav *)0x0) {
    return 0;
  }
  if (pWav->onSeek == (ma_dr_wav_seek_proc)0x0) {
    return 0;
  }
  if (pWav->onWrite != (ma_dr_wav_write_proc)0x0) {
    return 0;
  }
  uVar8 = pWav->totalPCMFrameCount;
  if (uVar8 != 0) {
    if (uVar8 < targetFrameIndex) {
      targetFrameIndex = uVar8;
    }
    uVar1 = pWav->translatedFormatTag;
    if ((uVar1 == 0x11) || (uVar1 == 2)) {
      if ((targetFrameIndex < pWav->readCursorInPCMFrames) &&
         (mVar2 = ma_dr_wav_seek_to_first_pcm_frame(pWav), mVar2 == 0)) {
        return 0;
      }
      uVar8 = targetFrameIndex - pWav->readCursorInPCMFrames;
      if (pWav->readCursorInPCMFrames <= targetFrameIndex && uVar8 != 0) {
        do {
          uVar4 = uVar8;
          if (uVar4 == 0) {
            return 1;
          }
          uVar8 = (ulong)(0x800 / pWav->channels);
          uVar9 = uVar4;
          if (uVar8 <= uVar4) {
            uVar9 = uVar8;
          }
          if (pWav->translatedFormatTag == 0x11) {
            mVar3 = ma_dr_wav_read_pcm_frames_s16__ima(pWav,uVar9,amStack_1038);
          }
          else if (pWav->translatedFormatTag == 2) {
            mVar3 = ma_dr_wav_read_pcm_frames_s16__msadpcm(pWav,uVar9,amStack_1038);
          }
          else {
            mVar3 = 0;
          }
          mVar5 = mVar3;
          if (mVar3 != uVar9) {
            mVar5 = 0;
          }
          uVar8 = uVar4 - mVar5;
        } while (mVar3 == uVar9);
        if (uVar4 != 0) {
          return 0;
        }
      }
    }
    else {
      if ((pWav->bitsPerSample & 7) == 0) {
        uVar6 = (uint)(pWav->fmt).channels * (uint)pWav->bitsPerSample >> 3;
      }
      else {
        uVar6 = (uint)(pWav->fmt).blockAlign;
      }
      if (((uVar1 & 0xfffe) != 6) || (uVar7 = 0, uVar6 == (pWav->fmt).channels)) {
        uVar7 = uVar6;
      }
      if (uVar7 == 0) {
        return 0;
      }
      uVar4 = uVar8 * uVar7 - pWav->bytesRemaining;
      uVar9 = targetFrameIndex * uVar7;
      uVar8 = uVar9 - uVar4;
      if ((uVar9 < uVar4 || uVar8 == 0) &&
         (mVar2 = ma_dr_wav_seek_to_first_pcm_frame(pWav), uVar8 = uVar9, mVar2 == 0)) {
        return 0;
      }
      for (; uVar8 != 0; uVar8 = uVar8 - uVar4) {
        uVar4 = 0x7fffffff;
        if (uVar8 < 0x7fffffff) {
          uVar4 = uVar8;
        }
        mVar2 = (*pWav->onSeek)(pWav->pUserData,(int)uVar4,ma_dr_wav_seek_origin_current);
        if (mVar2 == 0) {
          return 0;
        }
        pWav->readCursorInPCMFrames =
             pWav->readCursorInPCMFrames + (uVar4 & 0xffffffff) / (ulong)uVar7;
        pWav->bytesRemaining = pWav->bytesRemaining - uVar4;
      }
    }
  }
  return 1;
}

Assistant:

MA_API ma_bool32 ma_dr_wav_seek_to_pcm_frame(ma_dr_wav* pWav, ma_uint64 targetFrameIndex)
{
    if (pWav == NULL || pWav->onSeek == NULL) {
        return MA_FALSE;
    }
    if (pWav->onWrite != NULL) {
        return MA_FALSE;
    }
    if (pWav->totalPCMFrameCount == 0) {
        return MA_TRUE;
    }
    if (targetFrameIndex > pWav->totalPCMFrameCount) {
        targetFrameIndex = pWav->totalPCMFrameCount;
    }
    if (ma_dr_wav__is_compressed_format_tag(pWav->translatedFormatTag)) {
        if (targetFrameIndex < pWav->readCursorInPCMFrames) {
            if (!ma_dr_wav_seek_to_first_pcm_frame(pWav)) {
                return MA_FALSE;
            }
        }
        if (targetFrameIndex > pWav->readCursorInPCMFrames) {
            ma_uint64 offsetInFrames = targetFrameIndex - pWav->readCursorInPCMFrames;
            ma_int16 devnull[2048];
            while (offsetInFrames > 0) {
                ma_uint64 framesRead = 0;
                ma_uint64 framesToRead = offsetInFrames;
                if (framesToRead > ma_dr_wav_countof(devnull)/pWav->channels) {
                    framesToRead = ma_dr_wav_countof(devnull)/pWav->channels;
                }
                if (pWav->translatedFormatTag == MA_DR_WAVE_FORMAT_ADPCM) {
                    framesRead = ma_dr_wav_read_pcm_frames_s16__msadpcm(pWav, framesToRead, devnull);
                } else if (pWav->translatedFormatTag == MA_DR_WAVE_FORMAT_DVI_ADPCM) {
                    framesRead = ma_dr_wav_read_pcm_frames_s16__ima(pWav, framesToRead, devnull);
                } else {
                    MA_DR_WAV_ASSERT(MA_FALSE);
                }
                if (framesRead != framesToRead) {
                    return MA_FALSE;
                }
                offsetInFrames -= framesRead;
            }
        }
    } else {
        ma_uint64 totalSizeInBytes;
        ma_uint64 currentBytePos;
        ma_uint64 targetBytePos;
        ma_uint64 offset;
        ma_uint32 bytesPerFrame;
        bytesPerFrame = ma_dr_wav_get_bytes_per_pcm_frame(pWav);
        if (bytesPerFrame == 0) {
            return MA_FALSE;
        }
        totalSizeInBytes = pWav->totalPCMFrameCount * bytesPerFrame;
        currentBytePos = totalSizeInBytes - pWav->bytesRemaining;
        targetBytePos  = targetFrameIndex * bytesPerFrame;
        if (currentBytePos < targetBytePos) {
            offset = (targetBytePos - currentBytePos);
        } else {
            if (!ma_dr_wav_seek_to_first_pcm_frame(pWav)) {
                return MA_FALSE;
            }
            offset = targetBytePos;
        }
        while (offset > 0) {
            int offset32 = ((offset > INT_MAX) ? INT_MAX : (int)offset);
            if (!pWav->onSeek(pWav->pUserData, offset32, ma_dr_wav_seek_origin_current)) {
                return MA_FALSE;
            }
            pWav->readCursorInPCMFrames += offset32 / bytesPerFrame;
            pWav->bytesRemaining        -= offset32;
            offset                      -= offset32;
        }
    }
    return MA_TRUE;
}